

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O3

void __thiscall
helics::MessageTimer::MessageTimer
          (MessageTimer *this,function<void_(helics::ActionMessage_&&)> *sFunction)

{
  undefined8 uVar1;
  string local_40;
  
  *(undefined8 *)((long)&(this->sendFunction).super__Function_base._M_functor + 8) = 0;
  (this->sendFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->expirationTimes).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->sendFunction).super__Function_base._M_functor = 0;
  (this->expirationTimes).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expirationTimes).
  super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers).super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers).super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timerLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->buffers).super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->timerLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->timerLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->timerLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->timerLock).super___mutex_base._M_mutex + 8) = 0;
  (this->super_enable_shared_from_this<helics::MessageTimer>)._M_weak_this.
  super___weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<helics::MessageTimer>)._M_weak_this.
  super___weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->sendFunction)._M_invoker = sFunction->_M_invoker;
  if ((sFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(sFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->sendFunction).super__Function_base._M_functor =
         *(undefined8 *)&(sFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->sendFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->sendFunction).super__Function_base._M_manager =
         (sFunction->super__Function_base)._M_manager;
    (sFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    sFunction->_M_invoker = (_Invoker_type)0x0;
  }
  (this->timers).
  super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timers).
  super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timers).
  super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  gmlc::networking::AsioContextManager::getContextPointer
            ((AsioContextManager *)&this->contextPtr,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  gmlc::networking::AsioContextManager::startContextLoop((AsioContextManager *)&this->loopHandle);
  return;
}

Assistant:

MessageTimer::MessageTimer(std::function<void(ActionMessage&&)> sFunction):
    sendFunction(std::move(sFunction)),
    contextPtr(gmlc::networking::AsioContextManager::getContextPointer()),
    loopHandle(contextPtr->startContextLoop())
{
}